

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

String * __thiscall Bstrlib::String::operator+=(String *this,int c)

{
  String local_20;
  
  Print((char *)&local_20,"%d",c);
  operator+=(this,&local_20);
  ~String(&local_20);
  return this;
}

Assistant:

const String& String::operator +=(const int c)
    {
#ifndef HasFloatParsing
        char buffer[12] = { c < 0 ? '-': '\0' };
        utoa((unsigned long)(c < 0 ? -c : c), &buffer[c < 0 ? 1 : 0], 10);
        return *this += buffer;
#else
        return *this += String::Print("%d", c);
#endif
    }